

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O3

TimestampCastResult
duckdb::Timestamp::TryConvertTimestampTZ
          (char *str,idx_t len,timestamp_t *result,bool *has_offset,string_t *tz,
          optional_ptr<int,_true> nanos)

{
  char *__src;
  byte bVar1;
  char *pcVar2;
  string_t *psVar3;
  DateCastResult DVar4;
  bool bVar5;
  int64_t iVar6;
  char *pcVar7;
  idx_t iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  date_t date;
  int ss;
  int mm;
  int hh;
  idx_t time_pos;
  dtime_t time;
  idx_t local_80;
  date_t local_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  char *local_60;
  int local_54;
  int local_50;
  int local_4c;
  string_t *local_48;
  idx_t local_40;
  dtime_t local_38;
  
  *has_offset = false;
  local_60 = str;
  DVar4 = Date::TryConvertDate(str,len,&local_80,&local_74,has_offset,false);
  if (DVar4 != ERROR_INCORRECT_FORMAT) {
    if (DVar4 == ERROR_RANGE) {
      DVar4 = ERROR_RANGE|ERROR_INCORRECT_FORMAT;
    }
    else {
      local_48 = tz;
      if (local_80 == len) {
        if (local_74.days == -0x7fffffff) {
          iVar6 = -0x7fffffffffffffff;
        }
        else {
          if (local_74.days != 0x7fffffff) {
            bVar5 = TryFromDatetime(local_74,(dtime_t)0x0,result);
            return !bVar5 * '\x03';
          }
          iVar6 = 0x7fffffffffffffff;
        }
        result->value = iVar6;
      }
      else {
        if ((local_60[local_80] == 'T') || (iVar8 = local_80, local_60[local_80] == ' ')) {
          iVar8 = local_80 + 1;
        }
        local_40 = 0;
        bVar5 = Time::TryConvertInternal
                          (local_60 + iVar8,len - iVar8,&local_40,&local_38,false,nanos);
        if (!bVar5) {
          return ERROR_INCORRECT_FORMAT;
        }
        if (86400000000 < local_38.micros) {
          return ERROR_RANGE;
        }
        uVar9 = iVar8 + local_40;
        local_80 = uVar9;
        bVar5 = TryFromDatetime(local_74,local_38,result);
        pcVar7 = local_60;
        if (!bVar5) {
          return ERROR_RANGE;
        }
        if (uVar9 < len) {
          if (local_60[uVar9] == 'Z') {
            *has_offset = true;
            uVar9 = uVar9 + 1;
          }
          else {
            bVar5 = TryParseUTCOffset(local_60,&local_80,len,&local_4c,&local_50,&local_54);
            psVar3 = local_48;
            if (bVar5) {
              bVar5 = TrySubtractOperator::Operation<long,long,long>
                                (result->value,
                                 (long)local_54 * 1000000 +
                                 (long)local_50 * 60000000 + (long)local_4c * 3600000000,
                                 &result->value);
              if (!bVar5) {
                return ERROR_RANGE;
              }
              *has_offset = true;
              uVar9 = local_80;
            }
            else {
              if (pcVar7[local_80] != ' ') {
                return ERROR_NON_UTC_TIMEZONE;
              }
              uVar9 = local_80 + 1;
              if (uVar9 < len) {
                __src = pcVar7 + uVar9;
                uVar11 = uVar9;
                do {
                  bVar1 = pcVar7[uVar11];
                  if (((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
                     ((iVar8 = uVar11, 0x34 < bVar1 - 0x2b ||
                      ((0x10000000000015U >> ((ulong)(bVar1 - 0x2b) & 0x3f) & 1) == 0)))) break;
                  uVar11 = uVar11 + 1;
                  iVar8 = len;
                } while (len != uVar11);
                if (iVar8 - uVar9 != 0) {
                  uVar10 = (uint)(iVar8 - uVar9);
                  if (uVar10 < 0xd) {
                    local_68 = 0;
                    local_70 = 0;
                    uStack_6c = 0;
                    pcVar2 = (char *)0x0;
                    if (uVar10 != 0) {
                      switchD_012b9b0d::default(&local_70,__src,(ulong)(uVar10 & 0xf));
                      pcVar7 = local_60;
                      pcVar2 = (char *)CONCAT44(local_68,uStack_6c);
                    }
                  }
                  else {
                    local_70 = *(undefined4 *)__src;
                    pcVar2 = __src;
                  }
                  local_68 = (undefined4)((ulong)pcVar2 >> 0x20);
                  uStack_6c = SUB84(pcVar2,0);
                  (psVar3->value).pointer.length = uVar10;
                  *(ulong *)((long)&psVar3->value + 4) = CONCAT44(uStack_6c,local_70);
                  *(undefined4 *)((long)&psVar3->value + 0xc) = local_68;
                  uVar9 = iVar8;
                }
              }
            }
          }
          if (uVar9 < len) {
            do {
              if ((4 < (byte)pcVar7[uVar9] - 9) && (pcVar7[uVar9] != 0x20)) {
                return ERROR_INCORRECT_FORMAT;
              }
              uVar9 = uVar9 + 1;
            } while (len != uVar9);
          }
        }
      }
      DVar4 = SUCCESS;
    }
  }
  return DVar4;
}

Assistant:

TimestampCastResult Timestamp::TryConvertTimestampTZ(const char *str, idx_t len, timestamp_t &result, bool &has_offset,
                                                     string_t &tz, optional_ptr<int32_t> nanos) {
	idx_t pos;
	date_t date;
	dtime_t time;
	has_offset = false;
	switch (Date::TryConvertDate(str, len, pos, date, has_offset)) {
	case DateCastResult::ERROR_INCORRECT_FORMAT:
		return TimestampCastResult::ERROR_INCORRECT_FORMAT;
	case DateCastResult::ERROR_RANGE:
		return TimestampCastResult::ERROR_RANGE;
	default:
		break;
	}
	if (pos == len) {
		// no time: only a date or special
		if (date == date_t::infinity()) {
			result = timestamp_t::infinity();
			return TimestampCastResult::SUCCESS;
		} else if (date == date_t::ninfinity()) {
			result = timestamp_t::ninfinity();
			return TimestampCastResult::SUCCESS;
		}
		return Timestamp::TryFromDatetime(date, dtime_t(0), result) ? TimestampCastResult::SUCCESS
		                                                            : TimestampCastResult::ERROR_RANGE;
	}
	// try to parse a time field
	if (str[pos] == ' ' || str[pos] == 'T') {
		pos++;
	}
	idx_t time_pos = 0;
	// TryConvertTime may recursively call us, so we opt for a stricter
	// operation. Note that we can't pass strict== true here because we
	// want to process any suffix.
	if (!Time::TryConvertInterval(str + pos, len - pos, time_pos, time, false, nanos)) {
		return TimestampCastResult::ERROR_INCORRECT_FORMAT;
	}
	//	We parsed an interval, so make sure it is in range.
	if (time.micros > Interval::MICROS_PER_DAY) {
		return TimestampCastResult::ERROR_RANGE;
	}
	pos += time_pos;
	if (!Timestamp::TryFromDatetime(date, time, result)) {
		return TimestampCastResult::ERROR_RANGE;
	}
	if (pos < len) {
		// skip a "Z" at the end (as per the ISO8601 specs)
		int hh, mm, ss;
		if (str[pos] == 'Z') {
			pos++;
			has_offset = true;
		} else if (Timestamp::TryParseUTCOffset(str, pos, len, hh, mm, ss)) {
			const int64_t delta =
			    hh * Interval::MICROS_PER_HOUR + mm * Interval::MICROS_PER_MINUTE + ss * Interval::MICROS_PER_SEC;
			if (!TrySubtractOperator::Operation(result.value, delta, result.value)) {
				return TimestampCastResult::ERROR_RANGE;
			}
			has_offset = true;
		} else {
			// Parse a time zone: / [A-Za-z0-9/_]+/
			if (str[pos++] != ' ') {
				return TimestampCastResult::ERROR_NON_UTC_TIMEZONE;
			}
			auto tz_name = str + pos;
			for (; pos < len && CharacterIsTimeZone(str[pos]); ++pos) {
				continue;
			}
			auto tz_len = str + pos - tz_name;
			if (tz_len) {
				tz = string_t(tz_name, UnsafeNumericCast<uint32_t>(tz_len));
			}
			// Note that the caller must reinterpret the instant we return to the given time zone
		}

		// skip any spaces at the end
		while (pos < len && StringUtil::CharacterIsSpace(str[pos])) {
			pos++;
		}
		if (pos < len) {
			return TimestampCastResult::ERROR_INCORRECT_FORMAT;
		}
	}
	return TimestampCastResult::SUCCESS;
}